

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O1

void __thiscall
jaegertracing::Tracer::Tracer
          (Tracer *this,string *serviceName,shared_ptr<jaegertracing::samplers::Sampler> *sampler,
          shared_ptr<jaegertracing::reporters::Reporter> *reporter,
          shared_ptr<jaegertracing::logging::Logger> *logger,
          shared_ptr<jaegertracing::metrics::Metrics> *metrics,HeadersConfig *headersConfig,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,int options)

{
  shared_ptr<jaegertracing::metrics::Metrics> *metrics_00;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *this_00;
  char *pcVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  IPAddress *this_01;
  int iVar6;
  uint uVar7;
  long lVar8;
  RestrictionManager *pRVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  value_type *__x;
  random_device device;
  char *local_1420;
  long local_1418;
  char local_1410 [16];
  IPAddress *local_1400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f8;
  HTTPHeaderPropagator *local_13d8;
  TextMapPropagator *local_13d0;
  string *local_13c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_13c0;
  undefined1 local_13b8 [32];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_1398 [124];
  
  (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
  super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
  super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Tracer)._vptr_Tracer = (_func_int **)&PTR__Tracer_00266920;
  local_13c0 = &(this->_serviceName).field_2;
  (this->_serviceName)._M_dataplus._M_p = (pointer)local_13c0;
  pcVar2 = (serviceName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_serviceName,pcVar2,pcVar2 + serviceName->_M_string_length);
  local_1400 = &this->_hostIPv4;
  local_13c8 = &this->_serviceName;
  net::IPAddress::localIP(local_1400,2);
  (this->_sampler).super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (sampler->
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (sampler->
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_sampler).super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->_reporter).
  super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reporter->super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  p_Var3 = (reporter->
           super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_reporter).
  super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->_metrics).super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (metrics->super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var3 = (metrics->super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_metrics).super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->_logger).super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (logger->super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (logger->super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_logger).super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  metrics_00 = &this->_metrics;
  (this->_randomNumberGenerator)._M_x[0] = 0x1571;
  lVar8 = 1;
  uVar12 = 0x1571;
  lVar10 = 0x21;
  do {
    lVar11 = (uVar12 >> 0x3e ^ uVar12) * 0x5851f42d4c957f2d;
    uVar12 = lVar11 + lVar8;
    *(long *)((this->_hostIPv4)._addr.__ss_padding + lVar10 * 8 + -0x3a) = lVar10 + lVar11 + -0x20;
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x158);
  (this->_randomNumberGenerator)._M_p = 0x138;
  (this->_randomMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_randomMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_randomMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_randomMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_randomMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  propagation::
  Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
  Propagator(&this->_textPropagator,headersConfig,metrics_00);
  local_13d8 = &this->_httpHeaderPropagator;
  local_13d0 = &this->_textPropagator;
  propagation::
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  ::Propagator(&local_13d8->
                super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
               ,headersConfig,metrics_00);
  (this->_httpHeaderPropagator).
  super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  .super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>._vptr_Extractor =
       (_func_int **)&PTR__Propagator_00266c28;
  (this->_httpHeaderPropagator).
  super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  .super_Injector<const_opentracing::v3::HTTPHeadersWriter_&>._vptr_Injector =
       (_func_int **)&PTR__HTTPHeaderPropagator_00266c70;
  propagation::BinaryPropagator::BinaryPropagator(&this->_binaryPropagator,metrics_00);
  this_00 = &this->_tags;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar9 = (RestrictionManager *)operator_new(0x10);
  pRVar9->_vptr_RestrictionManager = (_func_int **)&PTR__RestrictionManager_00266f88;
  *(undefined1 *)&pRVar9[1]._vptr_RestrictionManager = 1;
  *(undefined4 *)((long)&pRVar9[1]._vptr_RestrictionManager + 4) = 0x800;
  (this->_restrictionManager)._M_t.
  super___uniq_ptr_impl<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::baggage::RestrictionManager_*,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  .super__Head_base<0UL,_jaegertracing::baggage::RestrictionManager_*,_false>._M_head_impl = pRVar9;
  peVar4 = (this->_metrics).
           super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->_baggageSetter)._restrictionManager = pRVar9;
  (this->_baggageSetter)._metrics = peVar4;
  this->_options = options;
  local_1420 = local_1410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1420,"jaeger.version","");
  pcVar1 = local_13b8 + 0x10;
  local_13b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_13b8,local_1420,local_1420 + local_1418)
  ;
  local_13f8._M_dataplus._M_p = "C++-0.5.0";
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<char_const*&,opentracing::v3::util::detail::value_traits<char_const*&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (local_1398,(char **)&local_13f8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
  emplace_back<jaegertracing::Tag>(this_00,(Tag *)local_13b8);
  opentracing::v3::util::
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  ::~variant(local_1398);
  if ((char *)local_13b8._0_8_ != pcVar1) {
    operator_delete((void *)local_13b8._0_8_);
  }
  if (local_1420 != local_1410) {
    operator_delete(local_1420);
  }
  local_1420 = local_1410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1420,"hostname","");
  platform::hostname_abi_cxx11_();
  local_13b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_13b8,local_1420,local_1420 + local_1418)
  ;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<std::__cxx11::string,opentracing::v3::util::detail::value_traits<std::__cxx11::string,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (local_1398,&local_13f8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
  emplace_back<jaegertracing::Tag>(this_00,(Tag *)local_13b8);
  opentracing::v3::util::
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  ::~variant(local_1398);
  if ((char *)local_13b8._0_8_ != pcVar1) {
    operator_delete((void *)local_13b8._0_8_);
  }
  this_01 = local_1400;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
    operator_delete(local_13f8._M_dataplus._M_p);
  }
  if (local_1420 != local_1410) {
    operator_delete(local_1420);
  }
  local_1398[2].type_index = 0;
  local_1398[2].data._0_8_ = 0;
  local_1398[1].data._16_8_ = 0;
  local_1398[1].data._24_8_ = 0;
  local_1398[1].data._0_8_ = 0;
  local_1398[1].data._8_8_ = 0;
  local_1398[0].data._24_8_ = 0;
  local_1398[1].type_index = 0;
  local_1398[0].data._8_8_ = 0;
  local_1398[0].data._16_8_ = 0;
  local_1398[0].type_index = 0;
  local_1398[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_13b8._16_8_ = 0;
  local_13b8._24_8_ = 0;
  local_13b8._0_8_ = (pointer)0x0;
  local_13b8._8_8_ = (_func_result_type_void_ptr *)0x0;
  local_1398[2].data._8_4_ = 0x10;
  if (((this->_hostIPv4)._addrLen == 0x10) && (iVar6 = bcmp(this_01,local_13b8,0x10), iVar6 == 0)) {
    peVar5 = (this->_logger).
             super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_13b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_13b8,"Unable to determine this host\'s IP address","");
    (*peVar5->_vptr_Logger[2])(peVar5,local_13b8);
    pcVar13 = (char *)local_13b8._0_8_;
    if ((char *)local_13b8._0_8_ == pcVar1) goto LAB_001bcab9;
  }
  else {
    local_1420 = local_1410;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1420,"ip","");
    net::IPAddress::host_abi_cxx11_(&local_13f8,this_01);
    local_13b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_13b8,local_1420,local_1420 + local_1418);
    opentracing::v3::util::
    variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
    ::
    variant<std::__cxx11::string,opentracing::v3::util::detail::value_traits<std::__cxx11::string,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
              (local_1398,&local_13f8);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
    emplace_back<jaegertracing::Tag>(this_00,(Tag *)local_13b8);
    opentracing::v3::util::
    variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
    ::~variant(local_1398);
    if ((char *)local_13b8._0_8_ != pcVar1) {
      operator_delete((void *)local_13b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
      operator_delete(local_13f8._M_dataplus._M_p);
    }
    pcVar13 = local_1420;
    if (local_1420 == local_1410) goto LAB_001bcab9;
  }
  operator_delete(pcVar13);
LAB_001bcab9:
  __x = (tags->super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar12 = (long)(tags->super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__x;
  if (0 < (long)uVar12) {
    lVar8 = uVar12 / 0x48 + 1;
    do {
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::push_back(this_00,__x);
      __x = __x + 1;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  std::random_device::random_device((random_device *)local_13b8);
  uVar7 = std::random_device::_M_getval();
  uVar12 = (ulong)uVar7;
  (this->_randomNumberGenerator)._M_x[0] = uVar12;
  lVar8 = 1;
  lVar10 = 0x21;
  do {
    lVar11 = (uVar12 >> 0x3e ^ uVar12) * 0x5851f42d4c957f2d;
    uVar12 = lVar11 + lVar8;
    *(long *)((this->_hostIPv4)._addr.__ss_padding + lVar10 * 8 + -0x3a) = lVar10 + lVar11 + -0x20;
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x158);
  (this->_randomNumberGenerator)._M_p = 0x138;
  std::random_device::_M_fini();
  return;
}

Assistant:

Tracer(const std::string& serviceName,
           const std::shared_ptr<samplers::Sampler>& sampler,
           const std::shared_ptr<reporters::Reporter>& reporter,
           const std::shared_ptr<logging::Logger>& logger,
           const std::shared_ptr<metrics::Metrics>& metrics,
           const propagation::HeadersConfig& headersConfig,
           const std::vector<Tag>& tags,
           int options)
        : _serviceName(serviceName)
        , _hostIPv4(net::IPAddress::localIP(AF_INET))
        , _sampler(sampler)
        , _reporter(reporter)
        , _metrics(metrics)
        , _logger(logger)
        , _randomNumberGenerator()
        , _textPropagator(headersConfig, _metrics)
        , _httpHeaderPropagator(headersConfig, _metrics)
        , _binaryPropagator(_metrics)
        , _tags()
        , _restrictionManager(new baggage::DefaultRestrictionManager(0))
        , _baggageSetter(*_restrictionManager, *_metrics)
        , _options(options)
    {
        _tags.push_back(Tag(kJaegerClientVersionTagKey, kJaegerClientVersion));

        try {
            _tags.push_back(Tag(kTracerHostnameTagKey, platform::hostname()));
        } catch (const std::system_error&) {
            // Ignore hostname error.
        }

        if (_hostIPv4 == net::IPAddress()) {
            _logger->error("Unable to determine this host's IP address");
        }
        else {
            _tags.push_back(Tag(kTracerIPTagKey, _hostIPv4.host()));
        }

        std::copy(tags.cbegin(), tags.cend(), std::back_inserter(_tags));

        std::random_device device;
        _randomNumberGenerator.seed(device());
    }